

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O3

void do_cmd_knowledge_monsters(char *name,wchar_t row)

{
  group_funcs g_funcs;
  monster_race *pmVar1;
  monster_race *pmVar2;
  wchar_t wVar3;
  join_t *pjVar4;
  _Bool _Var5;
  wchar_t o_count;
  int *obj_list;
  ulong uVar6;
  ui_monster_category *puVar7;
  long lVar8;
  wchar_t wVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  group_funcs r_funcs;
  undefined4 uStack_34;
  
  wVar3 = n_monster_group;
  o_count = count_known_monsters();
  default_join = (join_t *)mem_zalloc((long)o_count * 8);
  obj_list = (int *)mem_zalloc((long)o_count << 2);
  if (z_info->r_max != 0) {
    uVar11 = 0;
    wVar9 = L'\0';
    do {
      pmVar2 = r_info;
      if (((l_list[uVar11].all_known != false) || (l_list[uVar11].sights != 0)) &&
         (r_info[uVar11].name != (char *)0x0)) {
        if (n_monster_group < L'\x02') {
          uVar6 = (ulong)(uint)(n_monster_group + L'\xffffffff');
        }
        else {
          pmVar1 = r_info + uVar11;
          lVar8 = 0;
          bVar12 = false;
          puVar7 = monster_group;
          do {
            if (0 < (long)puVar7[lVar8].n_inc_bases) {
              lVar10 = 0;
              do {
                if (pmVar2[uVar11].base == puVar7[lVar8].inc_bases[lVar10]) {
                  if (o_count <= wVar9) {
                    __assert_fail("ind < m_count",
                                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                                  ,0x53f,"void do_cmd_knowledge_monsters(const char *, int)");
                  }
                  goto LAB_001d749b;
                }
                lVar10 = lVar10 + 1;
              } while (puVar7[lVar8].n_inc_bases != lVar10);
            }
            _Var5 = flag_is_inter(pmVar1->flags,puVar7[lVar8].inc_flags,0xb);
            puVar7 = monster_group;
            if (_Var5) {
              if (o_count <= wVar9) {
                __assert_fail("ind < m_count",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                              ,0x54c,"void do_cmd_knowledge_monsters(const char *, int)");
              }
LAB_001d749b:
              obj_list[wVar9] = wVar9;
              pjVar4 = default_join;
              default_join[wVar9].oid = (wchar_t)uVar11;
              pjVar4[wVar9].gid = (wchar_t)lVar8;
              wVar9 = wVar9 + L'\x01';
              bVar12 = true;
            }
            lVar8 = lVar8 + 1;
            uVar6 = (long)n_monster_group - 1;
          } while (lVar8 < (long)uVar6);
          if (bVar12) goto LAB_001d7515;
        }
        if (o_count <= wVar9) {
          __assert_fail("ind < m_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-knowledge.c"
                        ,0x556,"void do_cmd_knowledge_monsters(const char *, int)");
        }
        obj_list[wVar9] = wVar9;
        pjVar4 = default_join;
        default_join[wVar9].oid = (wchar_t)uVar11;
        pjVar4[wVar9].gid = (wchar_t)uVar6;
        wVar9 = wVar9 + L'\x01';
      }
LAB_001d7515:
      uVar11 = uVar11 + 1;
    } while (uVar11 < z_info->r_max);
  }
  uVar11 = CONCAT44(uStack_34,wVar3) & 0xffffff00ffffffff;
  g_funcs.gcomp = m_cmp_race;
  g_funcs.name = race_name;
  g_funcs.group = default_group_id;
  g_funcs.summary = mon_summary;
  g_funcs.maxnum = (int)uVar11;
  g_funcs.easy_know = (_Bool)(char)(uVar11 >> 0x20);
  g_funcs._37_3_ = (int3)(uVar11 >> 0x28);
  display_knowledge("monsters",obj_list,o_count,g_funcs,
                    (member_funcs)
                    ZEXT4056(CONCAT832(recall_prompt,
                                       CONCAT824(m_xattr,CONCAT816(m_xchar,CONCAT88(mon_lore,
                                                  display_monster))))),
                    "                   Sym  Kills");
  mem_free(default_join);
  mem_free(obj_list);
  return;
}

Assistant:

static void do_cmd_knowledge_monsters(const char *name, int row)
{
	group_funcs r_funcs = {race_name, m_cmp_race, default_group_id,
		mon_summary, n_monster_group, false };

	member_funcs m_funcs = {display_monster, mon_lore, m_xchar, m_xattr,
		recall_prompt, 0, 0};

	int *monsters;
	int m_count = count_known_monsters(), i, ind;

	default_join = mem_zalloc(m_count * sizeof(join_t));
	monsters = mem_zalloc(m_count * sizeof(int));

	ind = 0;
	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						assert(ind < m_count);
						monsters[ind] = ind;
						default_join[ind].oid = i;
						default_join[ind].gid = j;
						++ind;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				assert(ind < m_count);
				monsters[ind] = ind;
				default_join[ind].oid = i;
				default_join[ind].gid = j;
				++ind;
				classified = true;
			}
		}

		if (!classified) {
			assert(ind < m_count);
			monsters[ind] = ind;
			default_join[ind].oid = i;
			default_join[ind].gid = n_monster_group - 1;
			++ind;
		}
	}

	display_knowledge("monsters", monsters, m_count, r_funcs, m_funcs,
			"                   Sym  Kills");
	mem_free(default_join);
	mem_free(monsters);
}